

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void print_conditional_expression_tree(FILE *out,AST_Conditional_Expression *cond)

{
  fputc(0x28,(FILE *)out);
  print_ast(out,cond->left);
  fputc(0x3f,(FILE *)out);
  print_ast(out,cond->center);
  fputc(0x3a,(FILE *)out);
  print_ast(out,cond->right);
  fputc(0x29,(FILE *)out);
  return;
}

Assistant:

void print_conditional_expression_tree(FILE *out,struct AST_Conditional_Expression *cond)
{
	fprintf(out,"(");
	print_ast(out,cond->left);
	fprintf(out,"?");
	print_ast(out,cond->center);
	fprintf(out,":");
	print_ast(out,cond->right);
	fprintf(out,")");
}